

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

_Bool test_next_bits_iterate(void)

{
  size_t expected;
  size_t j;
  size_t startfrom;
  size_t i;
  size_t howmany;
  size_t buffer [3];
  int i_2;
  int i_1;
  bitset_t *b;
  size_t in_stack_ffffffffffffffa8;
  bitset_t *in_stack_ffffffffffffffb0;
  ulong uVar1;
  size_t *local_48;
  ulong local_38;
  size_t *startfrom_00;
  size_t in_stack_ffffffffffffffd8;
  size_t *in_stack_ffffffffffffffe0;
  bitset_t *in_stack_ffffffffffffffe8;
  int local_10;
  int local_c;
  
  bitset_create();
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    bitset_set(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  for (local_10 = 1000; local_10 < 0x44c; local_10 = local_10 + 2) {
    bitset_set(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  startfrom_00 = (size_t *)0x0;
  local_38 = 0;
  do {
    startfrom_00 = (size_t *)
                   bitset_next_set_bits
                             (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                              in_stack_ffffffffffffffd8,startfrom_00);
    if (startfrom_00 == (size_t *)0x0) {
      if (local_38 == 0x96) {
        bitset_free((bitset_t *)0x10259e);
        return true;
      }
      fprintf(_stderr,"Assertion failed in %s at line %d\n","test_next_bits_iterate",0x11d);
      exit(1);
    }
    for (local_48 = (size_t *)0x0; local_48 < startfrom_00;
        local_48 = (size_t *)((long)local_48 + 1)) {
      uVar1 = local_38;
      if (99 < local_38) {
        uVar1 = (local_38 - 100) * 2 + 1000;
      }
      if (*(ulong *)(&stack0xffffffffffffffd8 + (long)local_48 * 8) != uVar1) {
        fprintf(_stderr,"Assertion failed in %s at line %d\n","test_next_bits_iterate",0x119);
        exit(1);
      }
      local_38 = local_38 + 1;
    }
  } while( true );
}

Assistant:

bool test_next_bits_iterate() {
  bitset_t *b = bitset_create();
  for (int i = 0; i < 100; i++)
    bitset_set(b, i);
  for (int i = 1000; i < 1100; i += 2)
    bitset_set(b, i);

  size_t buffer[3];
  size_t howmany = 0;
  size_t i = 0;
  for (size_t startfrom = 0;
       (howmany = bitset_next_set_bits(
            b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
       startfrom++) {
    for (size_t j = 0; j < howmany; j++) {
      size_t expected;
      if (i < 100) {
        expected = i;
      } else {
        expected = 1000 + 2 * (i - 100);
      }
      TEST_ASSERT(buffer[j] == expected);
      ++i;
    }
  }
  TEST_ASSERT(i == 150);
  bitset_free(b);
  return true;
}